

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int push_signature_algorithms(ptls_buffer_t *sendbuf)

{
  size_t sVar1;
  int iVar2;
  undefined8 in_RAX;
  long lVar3;
  undefined8 local_18;
  
  local_18 = in_RAX;
  iVar2 = ptls_buffer__do_pushv(sendbuf,"",2);
  if (iVar2 == 0) {
    sVar1 = sendbuf->off;
    local_18 = CONCAT26(0x408,(undefined6)local_18);
    iVar2 = ptls_buffer__do_pushv(sendbuf,(void *)((long)&local_18 + 6),2);
    if (iVar2 == 0) {
      local_18._0_6_ = CONCAT24(0x304,(undefined4)local_18);
      iVar2 = ptls_buffer__do_pushv(sendbuf,(void *)((long)&local_18 + 4),2);
      if (iVar2 == 0) {
        local_18._0_4_ = CONCAT22(0x104,(undefined2)local_18);
        iVar2 = ptls_buffer__do_pushv(sendbuf,(void *)((long)&local_18 + 2),2);
        if (iVar2 == 0) {
          local_18 = CONCAT62(local_18._2_6_,0x102);
          iVar2 = ptls_buffer__do_pushv(sendbuf,&local_18,2);
          if (iVar2 == 0) {
            lVar3 = sendbuf->off - sVar1;
            sendbuf->base[sVar1 - 2] = (uint8_t)((ulong)lVar3 >> 8);
            sendbuf->base[sVar1 - 1] = (uint8_t)lVar3;
            iVar2 = 0;
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int push_signature_algorithms(ptls_buffer_t *sendbuf)
{
    int ret;

    ptls_buffer_push_block(sendbuf, 2, {
        ptls_buffer_push16(sendbuf, PTLS_SIGNATURE_RSA_PSS_RSAE_SHA256);
        ptls_buffer_push16(sendbuf, PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256);
        ptls_buffer_push16(sendbuf, PTLS_SIGNATURE_RSA_PKCS1_SHA256);
        ptls_buffer_push16(sendbuf, PTLS_SIGNATURE_RSA_PKCS1_SHA1);
    });

    ret = 0;
Exit:
    return ret;
}